

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

bool google::protobuf::compiler::ApplyMapping
               (string *filename,string *old_prefix,string *new_prefix,string *result)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  bool local_a2;
  undefined1 local_88 [8];
  string after_prefix;
  int after_prefix_start;
  allocator local_51;
  string local_50;
  string *local_30;
  string *result_local;
  string *new_prefix_local;
  string *old_prefix_local;
  string *filename_local;
  
  local_30 = result;
  result_local = new_prefix;
  new_prefix_local = old_prefix;
  old_prefix_local = filename;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    bVar2 = ContainsParentReference(old_prefix_local);
    psVar1 = old_prefix_local;
    if (bVar2) {
      filename_local._7_1_ = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_50,"/",&local_51);
      bVar2 = HasPrefixString(psVar1,&local_50);
      local_a2 = true;
      if (!bVar2) {
        local_a2 = IsWindowsAbsolutePath(old_prefix_local);
      }
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      if (local_a2 == false) {
        std::__cxx11::string::assign((string *)local_30);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::push_back((char)local_30);
        }
        std::__cxx11::string::append((string *)local_30);
        filename_local._7_1_ = 1;
      }
      else {
        filename_local._7_1_ = 0;
      }
    }
    goto LAB_004b780c;
  }
  bVar2 = HasPrefixString(old_prefix_local,new_prefix_local);
  if (bVar2) {
    lVar5 = std::__cxx11::string::size();
    lVar6 = std::__cxx11::string::size();
    psVar1 = old_prefix_local;
    if (lVar5 == lVar6) {
      std::__cxx11::string::operator=((string *)local_30,(string *)result_local);
      filename_local._7_1_ = 1;
      goto LAB_004b780c;
    }
    after_prefix.field_2._8_4_ = 0xffffffff;
    std::__cxx11::string::size();
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
    psVar1 = old_prefix_local;
    if (*pcVar7 == '/') {
      iVar3 = std::__cxx11::string::size();
      after_prefix.field_2._8_4_ = iVar3 + 1;
    }
    else {
      std::__cxx11::string::size();
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
      if (*pcVar7 == '/') {
        after_prefix.field_2._8_4_ = std::__cxx11::string::size();
      }
    }
    if (after_prefix.field_2._8_4_ != -1) {
      std::__cxx11::string::substr((ulong)local_88,(ulong)old_prefix_local);
      bVar2 = ContainsParentReference((string *)local_88);
      if (bVar2) {
        filename_local._7_1_ = 0;
      }
      else {
        std::__cxx11::string::assign((string *)local_30);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::push_back((char)local_30);
        }
        std::__cxx11::string::append((string *)local_30);
        filename_local._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_88);
      goto LAB_004b780c;
    }
  }
  filename_local._7_1_ = 0;
LAB_004b780c:
  return (bool)(filename_local._7_1_ & 1);
}

Assistant:

static bool ApplyMapping(const string& filename,
                         const string& old_prefix,
                         const string& new_prefix,
                         string* result) {
  if (old_prefix.empty()) {
    // old_prefix matches any relative path.
    if (ContainsParentReference(filename)) {
      // We do not allow the file name to use "..".
      return false;
    }
    if (HasPrefixString(filename, "/") ||
        IsWindowsAbsolutePath(filename)) {
      // This is an absolute path, so it isn't matched by the empty string.
      return false;
    }
    result->assign(new_prefix);
    if (!result->empty()) result->push_back('/');
    result->append(filename);
    return true;
  } else if (HasPrefixString(filename, old_prefix)) {
    // old_prefix is a prefix of the filename.  Is it the whole filename?
    if (filename.size() == old_prefix.size()) {
      // Yep, it's an exact match.
      *result = new_prefix;
      return true;
    } else {
      // Not an exact match.  Is the next character a '/'?  Otherwise,
      // this isn't actually a match at all.  E.g. the prefix "foo/bar"
      // does not match the filename "foo/barbaz".
      int after_prefix_start = -1;
      if (filename[old_prefix.size()] == '/') {
        after_prefix_start = old_prefix.size() + 1;
      } else if (filename[old_prefix.size() - 1] == '/') {
        // old_prefix is never empty, and canonicalized paths never have
        // consecutive '/' characters.
        after_prefix_start = old_prefix.size();
      }
      if (after_prefix_start != -1) {
        // Yep.  So the prefixes are directories and the filename is a file
        // inside them.
        string after_prefix = filename.substr(after_prefix_start);
        if (ContainsParentReference(after_prefix)) {
          // We do not allow the file name to use "..".
          return false;
        }
        result->assign(new_prefix);
        if (!result->empty()) result->push_back('/');
        result->append(after_prefix);
        return true;
      }
    }
  }

  return false;
}